

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_ManSimBitPackOne
              (int nWords,Vec_Wrd_t *vSimsIn,Vec_Wrd_t *vSimsCare,int iPat,int *pLits,int nLits)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  word *pwVar4;
  int iVar_1;
  int iVar;
  int k;
  int i;
  word *pSimsC;
  word *pSimsI;
  int nLits_local;
  int *pLits_local;
  int iPat_local;
  Vec_Wrd_t *vSimsCare_local;
  Vec_Wrd_t *vSimsIn_local;
  int nWords_local;
  
  for (iVar = 0; iVar < iPat; iVar = iVar + 1) {
    for (iVar_1 = 0; iVar_1 < nLits; iVar_1 = iVar_1 + 1) {
      iVar1 = Abc_Lit2Var(pLits[iVar_1]);
      pwVar3 = Vec_WrdEntryP(vSimsIn,nWords * iVar1);
      pwVar4 = Vec_WrdEntryP(vSimsCare,nWords * iVar1);
      iVar1 = Abc_TtGetBit(pwVar4,iVar);
      if (iVar1 != 0) {
        iVar1 = Abc_TtGetBit(pwVar3,iVar);
        iVar2 = Abc_LitIsCompl(pLits[iVar_1]);
        if (iVar1 == iVar2) break;
      }
    }
    if (iVar_1 == nLits) break;
  }
  iVar_1 = 0;
  while( true ) {
    if (nLits <= iVar_1) {
      return (int)(iVar == iPat);
    }
    iVar1 = Abc_Lit2Var(pLits[iVar_1]);
    pwVar3 = Vec_WrdEntryP(vSimsIn,nWords * iVar1);
    pwVar4 = Vec_WrdEntryP(vSimsCare,nWords * iVar1);
    iVar1 = Abc_TtGetBit(pwVar4,iVar);
    if (iVar1 == 0) {
      iVar1 = Abc_TtGetBit(pwVar3,iVar);
      iVar2 = Abc_LitIsCompl(pLits[iVar_1]);
      if (iVar1 == iVar2) {
        Abc_TtXorBit(pwVar3,iVar);
      }
    }
    Abc_TtSetBit(pwVar4,iVar);
    iVar1 = Abc_TtGetBit(pwVar4,iVar);
    if (iVar1 == 0) break;
    iVar1 = Abc_TtGetBit(pwVar3,iVar);
    iVar2 = Abc_LitIsCompl(pLits[iVar_1]);
    if (iVar1 == iVar2) break;
    iVar_1 = iVar_1 + 1;
  }
  __assert_fail("Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k]))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0xdc,"int Gia_ManSimBitPackOne(int, Vec_Wrd_t *, Vec_Wrd_t *, int, int *, int)");
}

Assistant:

int Gia_ManSimBitPackOne( int nWords, Vec_Wrd_t * vSimsIn, Vec_Wrd_t * vSimsCare, int iPat, int * pLits, int nLits )
{
    word * pSimsI, * pSimsC; int i, k;
    for ( i = 0; i < iPat; i++ )
    {
        for ( k = 0; k < nLits; k++ )
        {
            int iVar = Abc_Lit2Var( pLits[k] );
            pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
            pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
            if ( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k])) )
                break;
        }
        if ( k == nLits )
            break;
    }
    for ( k = 0; k < nLits; k++ )
    {
        int iVar = Abc_Lit2Var( pLits[k] );
        pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
        pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
        if ( !Abc_TtGetBit(pSimsC, i) && Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k]) )
            Abc_TtXorBit( pSimsI, i );
        Abc_TtSetBit( pSimsC, i );
        assert( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k])) );
    }
    return (int)(i == iPat);
}